

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

int32 __thiscall
LowererMDArch::LowerCallArgs
          (LowererMDArch *this,Instr *callInstr,ushort callFlags,ArgSlot extraParams,
          IntConstOpnd **callInfoOpndRef)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  ushort index;
  uint uVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  SymOpnd *pSVar7;
  StackSym *pSVar8;
  StackSym *this_01;
  Opnd *newDst;
  RegOpnd *pRVar9;
  JITTimeFunctionBody *pJVar10;
  IntConstOpnd *this_02;
  Instr *pIVar11;
  uint uVar12;
  uint uVar13;
  uint argCount;
  Instr *local_60;
  
  if (this->helperCallArgsCount == 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x1cb,"(this->helperCallArgsCount == 0)",
                       "We don\'t support nested helper calls yet");
    if (!bVar2) goto LAB_005cc4d4;
    *puVar5 = 0;
  }
  local_60 = IR::Instr::GetPrevRealInstr(callInstr);
  pOVar6 = IR::Instr::UnlinkSrc2(callInstr);
  argCount = 0;
  while( true ) {
    bVar2 = IR::Opnd::IsSymOpnd(pOVar6);
    if (!bVar2) break;
    pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
    pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
    bVar2 = StackSym::IsArgSlotSym(pSVar8);
    if ((!bVar2) || ((pSVar8->field_0x18 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x1d9,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                         "Arg tree not single def...");
      if (!bVar2) goto LAB_005cc4d4;
      *puVar5 = 0;
    }
    IR::Opnd::Free(&pSVar7->super_Opnd,this->m_func);
    pIVar11 = (pSVar8->field_5).m_instrDef;
    pOVar6 = IR::Instr::UnlinkSrc2(pIVar11);
    LowererMD::ChangeToAssign(pIVar11);
    pSVar7 = IR::Opnd::AsSymOpnd(pIVar11->m_dst);
    this_01 = Sym::AsStackSym(pSVar7->m_sym);
    AVar3 = StackSym::GetArgSlotNum(this_01);
    if ((AVar3 == 0xffff) || (index = AVar3 + extraParams + 1, index < extraParams)) {
      Js::Throw::OutOfMemory();
    }
    newDst = GetArgSlotOpnd(this,index,pSVar8,false);
    IR::Instr::ReplaceDst(pIVar11,newDst);
    local_60 = IR::Instr::GetPrevRealInstr(pIVar11);
    pSVar8->field_0x18 = pSVar8->field_0x18 & 199;
    IR::Instr::Unlink(pIVar11);
    IR::Instr::InsertBefore(callInstr,pIVar11);
    argCount = argCount + 1;
  }
  pRVar9 = IR::Opnd::AsRegOpnd(pOVar6);
  pSVar8 = Sym::AsStackSym(&pRVar9->m_sym->super_Sym);
  bVar2 = StackSym::IsArgSlotSym(pSVar8);
  if ((bVar2) || ((pSVar8->field_0x18 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x205,"(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar2) goto LAB_005cc4d4;
    *puVar5 = 0;
  }
  pIVar11 = (pSVar8->field_5).m_instrDef;
  uVar12 = callInstr->m_opcode - 0xc4;
  if (((uVar12 < 0xb) && ((0x429U >> (uVar12 & 0x1f) & 1) != 0)) ||
     (callInstr->m_opcode == NewScObjectSpread)) {
    argCount = argCount + 1;
  }
  if ((pIVar11->m_opcode != StartCall) && (pIVar11->m_opcode != LoweredStartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x215,
                       "(startCallInstr->m_opcode == Js::OpCode::StartCall || startCallInstr->m_opcode == Js::OpCode::LoweredStartCall)"
                       ,"Problem with arg chain.");
    if (!bVar2) goto LAB_005cc4d4;
    *puVar5 = 0;
  }
  uVar4 = IR::Instr::GetArgOutCount(pIVar11,false);
  if (uVar4 != argCount) {
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar10);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x218,
                         "(startCallInstr->GetArgOutCount( false) == argCount || m_func->GetJITFunctionBody()->IsAsmJsMode())"
                         ,"ArgCount doesn\'t match StartCall count");
      if (!bVar2) {
LAB_005cc4d4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  if (callInstr->m_opcode != AsmJsCallI) {
    this_02 = Lowerer::MakeCallInfoConst(callFlags,argCount,this->m_func);
    if (callInfoOpndRef != (IntConstOpnd **)0x0) {
      IR::Opnd::Use(&this_02->super_Opnd,this->m_func);
      *callInfoOpndRef = this_02;
    }
    pOVar6 = GetArgSlotOpnd(this,extraParams + 1,(StackSym *)0x0,false);
    Lowerer::InsertMove(pOVar6,&this_02->super_Opnd,callInstr,true);
  }
  pIVar11->m_opcode = LoweredStartCall;
  uVar13 = extraParams + argCount + 1;
  this_00 = this->m_func;
  uVar12 = this_00->m_argSlotsForFunctionsCalled;
  if (this_00->m_argSlotsForFunctionsCalled <= uVar13) {
    uVar12 = uVar13;
  }
  this_00->m_argSlotsForFunctionsCalled = uVar12;
  pJVar10 = Func::GetJITFunctionBody(this_00);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar10);
  if (bVar2) {
    pOVar6 = IR::Instr::UnlinkSrc1(callInstr);
    pIVar11 = IR::Instr::GetNextRealInstr(local_60);
    GeneratePreCall(this,callInstr,pOVar6,pIVar11);
  }
  return uVar13;
}

Assistant:

int32
LowererMDArch::LowerCallArgs(IR::Instr *callInstr, ushort callFlags, Js::ArgSlot extraParams, IR::IntConstOpnd **callInfoOpndRef /* = nullptr */)
{
    AssertMsg(this->helperCallArgsCount == 0, "We don't support nested helper calls yet");

    const Js::ArgSlot       argOffset       = 1;
    uint32                  argCount        = 0;

    // Lower args and look for StartCall

    IR::Instr * argInstr = callInstr;
    IR::Instr * cfgInsertLoc = callInstr->GetPrevRealInstr();
    IR::Opnd *src2 = argInstr->UnlinkSrc2();
    while (src2->IsSymOpnd())
    {
        IR::SymOpnd *   argLinkOpnd = src2->AsSymOpnd();
        StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
        AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
        argLinkOpnd->Free(this->m_func);

        argInstr = argLinkSym->m_instrDef;

        src2 = argInstr->UnlinkSrc2();
        this->lowererMD->ChangeToAssign(argInstr);

        // Mov each arg to its argSlot

        Js::ArgSlot     argPosition = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
        Js::ArgSlot     index       = argOffset + argPosition;
        if(index < argPosition)
        {
            Js::Throw::OutOfMemory();
        }
        index += extraParams;
        if(index < extraParams)
        {
            Js::Throw::OutOfMemory();
        }

        IR::Opnd *      dstOpnd     = this->GetArgSlotOpnd(index, argLinkSym);

        argInstr->ReplaceDst(dstOpnd);

        cfgInsertLoc = argInstr->GetPrevRealInstr();

        // The arg sym isn't assigned a constant directly anymore
        // TODO: We can just move the instruction down next to the call if it is just a constant assignment
        // but AMD64 doesn't have the MOV mem,imm64 encoding, and we have no code to detect if the value can fit
        // into imm32 and hoist the src if it is not.
        argLinkSym->m_isConst = false;
        argLinkSym->m_isIntConst = false;
        argLinkSym->m_isTaggableIntConst = false;

        argInstr->Unlink();
        callInstr->InsertBefore(argInstr);
        argCount++;
    }


    IR::RegOpnd *       argLinkOpnd = src2->AsRegOpnd();
    StackSym *          argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");

    IR::Instr *startCallInstr = argLinkSym->m_instrDef;

    if (callInstr->m_opcode == Js::OpCode::NewScObject ||
        callInstr->m_opcode == Js::OpCode::NewScObjectSpread ||
        callInstr->m_opcode == Js::OpCode::NewScObjectLiteral ||
        callInstr->m_opcode == Js::OpCode::NewScObjArray ||
        callInstr->m_opcode == Js::OpCode::NewScObjArraySpread)
    {
        // These push an extra arg.
        argCount++;
    }

    AssertMsg(startCallInstr->m_opcode == Js::OpCode::StartCall ||
              startCallInstr->m_opcode == Js::OpCode::LoweredStartCall,
              "Problem with arg chain.");
    AssertMsg(startCallInstr->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == argCount ||
              m_func->GetJITFunctionBody()->IsAsmJsMode(),
        "ArgCount doesn't match StartCall count");
    //
    // Machine dependent lowering
    //

    if (callInstr->m_opcode != Js::OpCode::AsmJsCallI)
    {
        // Push argCount
        IR::IntConstOpnd *argCountOpnd = Lowerer::MakeCallInfoConst(callFlags, argCount, m_func);
        if (callInfoOpndRef)
        {
            argCountOpnd->Use(m_func);
            *callInfoOpndRef = argCountOpnd;
        }
        Lowerer::InsertMove(this->GetArgSlotOpnd(1 + extraParams), argCountOpnd, callInstr);
    }
    startCallInstr = this->LowerStartCall(startCallInstr);

    const uint32 argSlots = argCount + 1 + extraParams; // + 1 for call flags
    this->m_func->m_argSlotsForFunctionsCalled = max(this->m_func->m_argSlotsForFunctionsCalled, argSlots);

    if (m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        IR::Opnd * functionObjOpnd = callInstr->UnlinkSrc1();
        GeneratePreCall(callInstr, functionObjOpnd, cfgInsertLoc->GetNextRealInstr());
    }

    return argSlots;
}